

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O2

int hts_idx_push(hts_idx_t *idx,int tid,int beg,int end,uint64_t offset,int is_mapped)

{
  byte bVar1;
  uint32_t bin;
  uint64_t uVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  bidx_t **ppbVar6;
  lidx_t *plVar7;
  ulong uVar8;
  kh_bin_t *pkVar9;
  uint64_t *puVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint32_t uVar14;
  int iVar15;
  char *__format;
  int iVar16;
  long lVar17;
  
  uVar8 = (ulong)(uint)tid;
  iVar13 = 0;
  if (-1 < tid) {
    iVar13 = end;
  }
  iVar3 = beg;
  if (-1 >= tid) {
    iVar3 = -1;
  }
  iVar15 = idx->m;
  lVar17 = (long)iVar15;
  if (iVar15 <= tid) {
    iVar16 = 2;
    if (iVar15 != 0) {
      iVar16 = iVar15 * 2;
    }
    idx->m = iVar16;
    ppbVar6 = (bidx_t **)realloc(idx->bidx,(long)iVar16 << 3);
    idx->bidx = ppbVar6;
    plVar7 = (lidx_t *)realloc(idx->lidx,(long)idx->m << 4);
    idx->lidx = plVar7;
    memset(idx->bidx + lVar17,0,(idx->m - lVar17) * 8);
    memset(idx->lidx + lVar17,0,(idx->m - lVar17) * 0x10);
  }
  if (idx->n <= tid) {
    idx->n = tid + 1;
  }
  if ((idx->z).finished != 0) {
    return 0;
  }
  iVar15 = (idx->z).last_tid;
  if ((iVar15 == tid) && (-1 < tid || iVar15 < 0)) {
    if (tid < 0) {
LAB_0010d71b:
      idx->n_no_coor = idx->n_no_coor + 1;
      goto LAB_0010d71f;
    }
    if (beg < (idx->z).last_coor) {
      if (hts_verbose < 1) {
        return -1;
      }
      __format = "[E::%s] unsorted positions\n";
LAB_0010d9a2:
      fprintf(_stderr,__format,"hts_idx_push");
      return -1;
    }
    ppbVar6 = idx->bidx;
    if (ppbVar6[uVar8] == (bidx_t *)0x0) goto LAB_0010d88d;
  }
  else {
    if (tid < 0) {
      (idx->z).last_tid = tid;
      (idx->z).last_bin = 0xffffffff;
      goto LAB_0010d71b;
    }
    if (idx->n_no_coor != 0) {
      if (hts_verbose < 1) {
        return -1;
      }
      fprintf(_stderr,"[E::%s] NO_COOR reads not in a single block at the end %d %d\n",
              "hts_idx_push",uVar8);
      return -1;
    }
    ppbVar6 = idx->bidx;
    if (ppbVar6[uVar8] != (bidx_t *)0x0) {
      if (hts_verbose < 1) {
        return -1;
      }
      __format = "[E::%s] chromosome blocks not continuous\n";
      goto LAB_0010d9a2;
    }
    (idx->z).last_tid = tid;
    (idx->z).last_bin = 0xffffffff;
LAB_0010d88d:
    pkVar9 = kh_init_bin();
    ppbVar6[uVar8] = pkVar9;
  }
  if (is_mapped != 0) {
    bVar1 = (byte)idx->min_shift;
    lVar17 = (long)beg >> (bVar1 & 0x3f);
    plVar7 = idx->lidx + uVar8;
    uVar2 = (idx->z).last_off;
    iVar15 = idx->lidx[uVar8].m;
    uVar12 = (uint)((long)end + -1 >> (bVar1 & 0x3f));
    if (iVar15 <= (int)uVar12) {
      uVar5 = (int)uVar12 >> 1 | uVar12;
      uVar5 = (int)uVar5 >> 2 | uVar5;
      uVar5 = (int)uVar5 >> 4 | uVar5;
      uVar5 = (int)uVar5 >> 8 | uVar5;
      uVar5 = (int)uVar5 >> 0x10 | uVar5;
      plVar7->m = uVar5 + 1;
      puVar10 = (uint64_t *)realloc(plVar7->offset,(long)(int)uVar5 * 8 + 8);
      plVar7->offset = puVar10;
      memset(puVar10 + iVar15,0xff,((long)plVar7->m - (long)iVar15) * 8);
    }
    if ((uint)lVar17 == uVar12) {
      if (plVar7->offset[lVar17] == 0xffffffffffffffff) {
        plVar7->offset[lVar17] = uVar2;
      }
    }
    else {
      for (; lVar17 <= (int)uVar12; lVar17 = lVar17 + 1) {
        if (plVar7->offset[lVar17] == 0xffffffffffffffff) {
          plVar7->offset[lVar17] = uVar2;
        }
      }
    }
    if (plVar7->n <= (int)uVar12) {
      plVar7->n = uVar12 + 1;
    }
  }
LAB_0010d71f:
  iVar15 = idx->min_shift;
  iVar16 = idx->n_lvls;
  uVar14 = 0;
  uVar8 = (ulong)(uint)~(-1 << ((char)iVar16 * '\x03' & 0x1fU)) / 7;
  iVar11 = iVar16 * 3;
  do {
    iVar11 = iVar11 + -3;
    if (iVar16 < 1) {
LAB_0010d787:
      uVar4 = (idx->z).last_bin;
      if (uVar4 != uVar14) {
        bin = (idx->z).save_bin;
        if (bin != 0xffffffff) {
          insert_to_b(idx->bidx[(idx->z).save_tid],bin,(idx->z).save_off,(idx->z).last_off);
          uVar4 = (idx->z).last_bin;
        }
        if ((uVar4 == 0xffffffff) && ((idx->z).save_bin != 0xffffffff)) {
          uVar2 = (idx->z).last_off;
          (idx->z).off_end = uVar2;
          insert_to_b(idx->bidx[(idx->z).save_tid],idx->n_bins + 1,(idx->z).off_beg,uVar2);
          insert_to_b(idx->bidx[(idx->z).save_tid],idx->n_bins + 1,(idx->z).n_mapped,
                      (idx->z).n_unmapped);
          (idx->z).n_mapped = 0;
          (idx->z).n_unmapped = 0;
          (idx->z).off_beg = (idx->z).off_end;
        }
        (idx->z).save_off = (idx->z).last_off;
        (idx->z).last_bin = uVar14;
        (idx->z).save_bin = uVar14;
        (idx->z).save_tid = tid;
      }
      puVar10 = &(idx->z).n_mapped + (is_mapped == 0);
      *puVar10 = *puVar10 + 1;
      (idx->z).last_off = offset;
      (idx->z).last_coor = iVar3;
      return 0;
    }
    lVar17 = (long)iVar3 >> ((byte)iVar15 & 0x3f);
    if (lVar17 == (long)iVar13 + -1 >> ((byte)iVar15 & 0x3f)) {
      uVar14 = (int)uVar8 + (int)lVar17;
      goto LAB_0010d787;
    }
    iVar16 = iVar16 + -1;
    iVar15 = iVar15 + 3;
    uVar8 = (ulong)(uint)((int)uVar8 + (-1 << ((byte)iVar11 & 0x1f)));
  } while( true );
}

Assistant:

int hts_idx_push(hts_idx_t *idx, int tid, int beg, int end, uint64_t offset, int is_mapped)
{
    int bin;
    if (tid<0) beg = -1, end = 0;
    if (tid >= idx->m) { // enlarge the index
        int32_t oldm = idx->m;
        idx->m = idx->m? idx->m<<1 : 2;
        idx->bidx = (bidx_t**)realloc(idx->bidx, idx->m * sizeof(bidx_t*));
        idx->lidx = (lidx_t*) realloc(idx->lidx, idx->m * sizeof(lidx_t));
        memset(&idx->bidx[oldm], 0, (idx->m - oldm) * sizeof(bidx_t*));
        memset(&idx->lidx[oldm], 0, (idx->m - oldm) * sizeof(lidx_t));
    }
    if (idx->n < tid + 1) idx->n = tid + 1;
    if (idx->z.finished) return 0;
    if (idx->z.last_tid != tid || (idx->z.last_tid >= 0 && tid < 0)) { // change of chromosome
        if ( tid>=0 && idx->n_no_coor )
        {
            if (hts_verbose >= 1) fprintf(stderr,"[E::%s] NO_COOR reads not in a single block at the end %d %d\n", __func__, tid,idx->z.last_tid);
            return -1;
        }
        if (tid>=0 && idx->bidx[tid] != 0)
        {
            if (hts_verbose >= 1) fprintf(stderr, "[E::%s] chromosome blocks not continuous\n", __func__);
            return -1;
        }
        idx->z.last_tid = tid;
        idx->z.last_bin = 0xffffffffu;
    } else if (tid >= 0 && idx->z.last_coor > beg) { // test if positions are out of order
        if (hts_verbose >= 1) fprintf(stderr, "[E::%s] unsorted positions\n", __func__);
        return -1;
    }
    if ( tid>=0 )
    {
        if (idx->bidx[tid] == 0) idx->bidx[tid] = kh_init(bin);
        if ( is_mapped)
            insert_to_l(&idx->lidx[tid], beg, end, idx->z.last_off, idx->min_shift); // last_off points to the start of the current record
    }
    else idx->n_no_coor++;
    bin = hts_reg2bin(beg, end, idx->min_shift, idx->n_lvls);
    if ((int)idx->z.last_bin != bin) { // then possibly write the binning index
        if (idx->z.save_bin != 0xffffffffu) // save_bin==0xffffffffu only happens to the first record
            insert_to_b(idx->bidx[idx->z.save_tid], idx->z.save_bin, idx->z.save_off, idx->z.last_off);
        if (idx->z.last_bin == 0xffffffffu && idx->z.save_bin != 0xffffffffu) { // change of chr; keep meta information
            idx->z.off_end = idx->z.last_off;
            insert_to_b(idx->bidx[idx->z.save_tid], META_BIN(idx), idx->z.off_beg, idx->z.off_end);
            insert_to_b(idx->bidx[idx->z.save_tid], META_BIN(idx), idx->z.n_mapped, idx->z.n_unmapped);
            idx->z.n_mapped = idx->z.n_unmapped = 0;
            idx->z.off_beg = idx->z.off_end;
        }
        idx->z.save_off = idx->z.last_off;
        idx->z.save_bin = idx->z.last_bin = bin;
        idx->z.save_tid = tid;
    }
    if (is_mapped) ++idx->z.n_mapped;
    else ++idx->z.n_unmapped;
    idx->z.last_off = offset;
    idx->z.last_coor = beg;
    return 0;
}